

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseUnscopedName(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  State copy;
  
  bVar9 = ParseUnqualifiedName(state);
  bVar10 = true;
  if (!bVar9) {
    pcVar2 = state->mangled_cur;
    pcVar3 = state->out_cur;
    pcVar4 = state->out_begin;
    pcVar5 = state->out_end;
    pcVar6 = state->prev_name;
    iVar7 = state->prev_name_length;
    sVar8 = state->nest_level;
    bVar9 = state->append;
    bVar10 = state->overflowed;
    pcVar1 = state->mangled_cur;
    if ((*pcVar1 == 'S') && (pcVar1[1] == 't')) {
      state->mangled_cur = pcVar1 + 2;
      MaybeAppend(state,"std::");
      bVar11 = ParseUnqualifiedName(state);
      if (bVar11) {
        return true;
      }
    }
    state->prev_name = pcVar6;
    state->prev_name_length = iVar7;
    state->nest_level = sVar8;
    state->append = bVar9;
    state->overflowed = bVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool ParseUnscopedName(State *state) {
  if (ParseUnqualifiedName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseTwoCharToken(state, "St") &&
      MaybeAppend(state, "std::") &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}